

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igami.c
# Opt level: O0

double hcephes_igami(double a,double y0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int local_68;
  int local_64;
  int dir;
  int i;
  double dithresh;
  double lgm;
  double d;
  double y;
  double yh;
  double yl;
  double x;
  double x1;
  double x0;
  double y0_local;
  double a_local;
  
  x1 = INFINITY;
  yh = 0.0;
  x = 0.0;
  y = 1.0;
  dVar1 = 1.0 / (a * 9.0);
  dVar2 = hcephes_ndtri(y0);
  dVar3 = sqrt(dVar1);
  dVar1 = -dVar2 * dVar3 + (1.0 - dVar1);
  yl = a * dVar1 * dVar1 * dVar1;
  dVar1 = hcephes_lgam(a);
  local_64 = 0;
  while ((((local_64 < 10 && (yl <= x1)) && (x <= yl)) &&
         ((dVar2 = hcephes_igamc(a,yl), yh <= dVar2 && (dVar2 <= y))))) {
    if (y0 <= dVar2) {
      x = yl;
      y = dVar2;
    }
    else {
      x1 = yl;
      yh = dVar2;
    }
    dVar3 = log(yl);
    dVar3 = ((a - 1.0) * dVar3 + -yl) - dVar1;
    if (dVar3 < -709.782712893384) break;
    dVar3 = exp(dVar3);
    dVar2 = (dVar2 - y0) / -dVar3;
    if (ABS(dVar2 / yl) < 1.1102230246251565e-16) {
      return yl;
    }
    yl = yl - dVar2;
    local_64 = local_64 + 1;
  }
  lgm = 0.0625;
  dVar1 = yh;
  dVar2 = x1;
  if ((x1 == INFINITY) && (!NAN(x1))) {
    if (yl <= 0.0) {
      yl = 1.0;
    }
    while ((dVar1 = yh, dVar2 = x1, x1 == INFINITY && (!NAN(x1)))) {
      yl = (lgm + 1.0) * yl;
      dVar1 = hcephes_igamc(a,yl);
      dVar2 = yl;
      if (dVar1 < y0) break;
      lgm = lgm + lgm;
    }
  }
  x1 = dVar2;
  yh = dVar1;
  lgm = 0.5;
  local_68 = 0;
  for (local_64 = 0; local_64 < 400; local_64 = local_64 + 1) {
    yl = lgm * (x1 - x) + x;
    dVar1 = hcephes_igamc(a,yl);
    if (((ABS((x1 - x) / (x + x1)) < 5.551115123125783e-16) ||
        (ABS((dVar1 - y0) / y0) < 5.551115123125783e-16)) || (yl <= 0.0)) break;
    if (dVar1 < y0) {
      if (local_68 < 1) {
        if (local_68 < -1) {
          lgm = lgm * 0.5;
        }
        else {
          lgm = (y0 - dVar1) / (y - dVar1);
        }
      }
      else {
        local_68 = 0;
        lgm = 0.5;
      }
      local_68 = local_68 + -1;
      yh = dVar1;
      x1 = yl;
    }
    else {
      if (local_68 < 0) {
        local_68 = 0;
        lgm = 0.5;
      }
      else if (local_68 < 2) {
        lgm = (y0 - yh) / (dVar1 - yh);
      }
      else {
        lgm = lgm * 0.5 + 0.5;
      }
      local_68 = local_68 + 1;
      y = dVar1;
      x = yl;
    }
  }
  if ((yl == 0.0) && (!NAN(yl))) {
    hcephes_mtherr("igami",4);
  }
  return yl;
}

Assistant:

HCEPHES_API double hcephes_igami(double a, double y0) {
    double x0, x1, x, yl, yh, y, d, lgm, dithresh;
    int i, dir;

    /* bound the solution */
    x0 = HUGE_VAL;
    yl = 0;
    x1 = 0;
    yh = 1.0;
    dithresh = 5.0 * HCEPHES_MACHEP;

    /* approximation to inverse function */
    d = 1.0 / (9.0 * a);
    y = (1.0 - d - hcephes_ndtri(y0) * sqrt(d));
    x = a * y * y * y;

    lgm = hcephes_lgam(a);

    for (i = 0; i < 10; i++) {
        if (x > x0 || x < x1)
            goto ihalve;
        y = hcephes_igamc(a, x);
        if (y < yl || y > yh)
            goto ihalve;
        if (y < y0) {
            x0 = x;
            yl = y;
        } else {
            x1 = x;
            yh = y;
        }
        /* compute the derivative of the function at this point */
        d = (a - 1.0) * log(x) - x - lgm;
        if (d < -HCEPHES_MAXLOG)
            goto ihalve;
        d = -exp(d);
        /* compute the step to the next approximation of x */
        d = (y - y0) / d;
        if (fabs(d / x) < HCEPHES_MACHEP)
            goto done;
        x = x - d;
    }

/* Resort to interval halving if Newton iteration did not converge. */
ihalve:

    d = 0.0625;
    if (x0 == HUGE_VAL) {
        if (x <= 0.0)
            x = 1.0;
        while (x0 == HUGE_VAL) {
            x = (1.0 + d) * x;
            y = hcephes_igamc(a, x);
            if (y < y0) {
                x0 = x;
                yl = y;
                break;
            }
            d = d + d;
        }
    }
    d = 0.5;
    dir = 0;

    for (i = 0; i < 400; i++) {
        x = x1 + d * (x0 - x1);
        y = hcephes_igamc(a, x);
        lgm = (x0 - x1) / (x1 + x0);
        if (fabs(lgm) < dithresh)
            break;
        lgm = (y - y0) / y0;
        if (fabs(lgm) < dithresh)
            break;
        if (x <= 0.0)
            break;
        if (y >= y0) {
            x1 = x;
            yh = y;
            if (dir < 0) {
                dir = 0;
                d = 0.5;
            } else if (dir > 1)
                d = 0.5 * d + 0.5;
            else
                d = (y0 - yl) / (yh - yl);
            dir += 1;
        } else {
            x0 = x;
            yl = y;
            if (dir > 0) {
                dir = 0;
                d = 0.5;
            } else if (dir < -1)
                d = 0.5 * d;
            else
                d = (y0 - yl) / (yh - yl);
            dir -= 1;
        }
    }
    if (x == 0.0)
        hcephes_mtherr("igami", HCEPHES_UNDERFLOW);

done:
    return (x);
}